

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# VgaDebugGenerator.cpp
# Opt level: O2

void __thiscall VgaDebugGenerator::Generate_Mem(VgaDebugGenerator *this)

{
  string *__rhs;
  pointer pbVar1;
  int iVar2;
  ostream *poVar3;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *__return_storage_ptr__;
  int i;
  ulong uVar4;
  pointer pbVar5;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_250;
  ofstream fout;
  undefined8 uStack_220;
  uint auStack_218 [2];
  byte abStack_210 [480];
  
  __rhs = &(this->config).mem_file;
  std::operator+(&local_250,&(this->config).output_dir,__rhs);
  std::ofstream::ofstream(&fout,(string *)&local_250,_S_out);
  std::__cxx11::string::~string((string *)&local_250);
  if ((abStack_210[*(long *)(_fout + -0x18)] & 5) == 0) {
    pbVar1 = (this->templte).lines.
             super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
             ._M_impl.super__Vector_impl_data._M_finish;
    iVar2 = 0;
    for (pbVar5 = (this->templte).lines.
                  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                  ._M_impl.super__Vector_impl_data._M_start; pbVar5 != pbVar1; pbVar5 = pbVar5 + 1)
    {
      for (uVar4 = 0; (long)uVar4 < (long)(this->config).template_width; uVar4 = uVar4 + 1) {
        if (uVar4 < pbVar5->_M_string_length) {
          *(uint *)((long)auStack_218 + *(long *)(_fout + -0x18)) =
               *(uint *)((long)auStack_218 + *(long *)(_fout + -0x18)) & 0xffffffb5 | 8;
          *(undefined8 *)((long)&uStack_220 + *(long *)(_fout + -0x18)) = 2;
          poVar3 = std::operator<<((ostream *)&fout,0x30);
          poVar3 = (ostream *)
                   std::ostream::operator<<(poVar3,(int)(pbVar5->_M_dataplus)._M_p[uVar4]);
        }
        else {
          poVar3 = std::operator<<((ostream *)&fout,"00");
        }
        std::endl<char,std::char_traits<char>>(poVar3);
      }
      iVar2 = iVar2 + (int)uVar4;
    }
    for (; iVar2 < this->vga_size_pow2; iVar2 = iVar2 + 1) {
      poVar3 = std::operator<<((ostream *)&fout,"00");
      std::endl<char,std::char_traits<char>>(poVar3);
    }
    std::ofstream::~ofstream(&fout);
    return;
  }
  __return_storage_ptr__ =
       (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
       __cxa_allocate_exception(0x20);
  std::operator+(&local_250,"Failed to open memory file \'",__rhs);
  std::operator+(__return_storage_ptr__,&local_250,"\'");
  __cxa_throw(__return_storage_ptr__,&std::__cxx11::string::typeinfo,std::__cxx11::string::~string);
}

Assistant:

void VgaDebugGenerator::Generate_Mem() {
    std::ofstream fout(config.output_dir + config.mem_file);
    if (!fout) {
        throw "Failed to open memory file '" + config.mem_file + "'";
    }

    int curr = 0;
    for (const auto &line : templte.lines) {
        for (int i = 0; i < config.template_width; i++) {
            if (i < line.size()) {
                fout << std::hex << std::setw(2) << std::setfill('0') << static_cast<int>(line[i]) << std::endl;
            } else {
                fout << "00" << std::endl;
            }
            ++curr;
        }
    }
    while (curr < vga_size_pow2) {
        fout << "00" << std::endl;
        ++curr;
    }
}